

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void gen_spr_power9_mmu(CPUPPCState_conflict2 *env)

{
  _spr_register(env,0x1d0,"PTCR",spr_noaccess,spr_noaccess,spr_noaccess,spr_noaccess,
                spr_read_generic,spr_write_ptcr,0);
  _spr_register(env,0x330,"ASDR",spr_noaccess,spr_noaccess,spr_noaccess,spr_noaccess,
                spr_read_generic,spr_write_generic,0);
  return;
}

Assistant:

static void gen_spr_power9_mmu(CPUPPCState *env)
{
    /* Partition Table Control */
    spr_register_kvm_hv(env, SPR_PTCR, "PTCR",
                        SPR_NOACCESS, SPR_NOACCESS,
                        SPR_NOACCESS, SPR_NOACCESS,
                        &spr_read_generic, &spr_write_ptcr,
                        KVM_REG_PPC_PTCR, 0x00000000);
    /* Address Segment Descriptor Register */
    spr_register_hv(env, SPR_ASDR, "ASDR",
                    SPR_NOACCESS, SPR_NOACCESS,
                    SPR_NOACCESS, SPR_NOACCESS,
                    &spr_read_generic, &spr_write_generic,
                    0x0000000000000000);
}